

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

char * OpName::op_name(int op)

{
  int op_local;
  char *local_8;
  
  switch(op) {
  case 0:
    local_8 = "Mult";
    break;
  case 1:
  case 2:
    local_8 = "Div";
    break;
  case 3:
    local_8 = "Add";
    break;
  case 4:
    local_8 = "Sub";
    break;
  default:
    local_8 = "";
  }
  return local_8;
}

Assistant:

static const char* op_name(int op) 
	{
		switch (op)
		{
		case OpType::Mult:
			return "Mult";
		case OpType::Div:
		case OpType::Div2:
			return "Div";
		case OpType::Add:
			return "Add";
		case OpType::Sub:
			return "Sub";
		default:
			return "";
		}
	}